

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall Object_GetFound_Test::TestBody(Object_GetFound_Test *this)

{
  string *psVar1;
  char *message;
  initializer_list<pstore::dump::object::member> __l;
  AssertionResult gtest_ar;
  value_ptr v;
  object object;
  allocator_type local_b9;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  value_ptr local_50;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  undefined1 local_20;
  
  local_40._0_8_ = "Hello World";
  local_80._0_8_ = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,char_const*&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8),(string **)local_80,
             (allocator<pstore::dump::string> *)local_b8,(char **)local_40);
  local_50.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80._0_8_;
  local_50.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  local_b8 = (undefined1  [8])&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"key","");
  pstore::dump::object::member::member((member *)local_80,(string *)local_b8,&local_50);
  __l._M_len = 1;
  __l._M_array = (iterator)local_80;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             local_98,__l,&local_b9);
  local_40._0_8_ = &PTR__object_001f5ba0;
  local_40._8_8_ = local_98._0_8_;
  local_30._M_allocated_capacity = local_98._8_8_;
  local_30._8_8_ = local_98._16_8_;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  local_20 = 0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             local_98);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  psVar1 = (string *)(local_80 + 0x10);
  if ((string *)local_80._0_8_ != psVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_b8 != (undefined1  [8])&local_a8) {
    operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
  }
  local_80._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"key","");
  pstore::dump::object::get((object *)local_98,(string *)local_40);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>>
            ((internal *)local_b8,"v","object.get (\"key\")",&local_50,
             (shared_ptr<pstore::dump::value> *)local_98);
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((string *)local_80._0_8_ != psVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_b8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x9c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if ((string *)local_80._0_8_ != (string *)0x0) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             (local_40 + 8));
  pstore::dump::number_base::~number_base((number_base *)local_40);
  if (local_50.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST (Object, GetFound) {
    using namespace ::pstore::dump;
    auto v = make_value ("Hello World");
    object object{{{"key", v}}};
    EXPECT_EQ (v, object.get ("key"));
}